

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

void write_failure_test(void)

{
  fdb_doc *doc_00;
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  fdb_status fVar6;
  int iVar7;
  anomalous_callbacks *paVar8;
  size_t *__s;
  size_t sVar9;
  size_t asStackY_c0a0 [2];
  undefined8 uStackY_c090;
  fdb_commit_opt_t fStackY_c089;
  void *in_stack_ffffffffffff3f78;
  anomalous_callbacks *in_stack_ffffffffffff3f80;
  long alStack_c078 [66];
  undefined8 auStack_be68 [5931];
  undefined8 uStack_510;
  long *local_500;
  size_t *local_4f8;
  long local_4f0;
  char *local_4e8;
  long local_4e0;
  char *local_4d8;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fail_ctx_t fail_ctx;
  anomalous_callbacks *write_fail_cb;
  char temp [256];
  char bodybuf [256];
  char metabuf [256];
  char *keybuf;
  int anomaly_hit;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int keylen_limit;
  int m;
  int n;
  int r;
  int idx;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  uStack_510 = 0x105a58;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_510 = 0x105a65;
  memleak_start();
  bVar4 = false;
  uStackY_c090 = 0x105aa9;
  paVar8 = get_default_anon_cbs();
  paVar8->pwrite_cb = pwrite_failure_cb;
  uStackY_c090 = 0x105ae3;
  system("rm -rf  anomaly_test* > errorlog.txt");
  uStackY_c090 = 0x105af9;
  filemgr_ops_anomalous_init(in_stack_ffffffffffff3f80,in_stack_ffffffffffff3f78);
  uStackY_c090 = 0x105b0f;
  fdb_get_default_config();
  uStackY_c090 = 0x105b1b;
  fdb_get_default_kvs_config();
  lVar3 = -((long)(kvs_config.custom_cmp_param._4_4_ + -0x100) + 0xfU & 0xfffffffffffffff0);
  __s = (size_t *)((long)alStack_c078 + lVar3 + -0x10);
  *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105b82;
  fdb_open(*(fdb_file_handle ***)((long)auStack_be68 + lVar3 + 0x10),
           *(char **)((long)auStack_be68 + lVar3 + 8),*(fdb_config **)((long)auStack_be68 + lVar3));
  *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105b96;
  fdb_kvs_open_default
            (*(fdb_file_handle **)((long)alStack_c078 + lVar3 + -8),(fdb_kvs_handle **)*__s,
             *(fdb_kvs_config **)((long)&stack0xffffffffffff3f70 + lVar3));
  for (idx = 0; idx < kvs_config.custom_cmp_param._4_4_ + -0x101; idx = idx + 1) {
    *(undefined1 *)((long)__s + (long)idx) = 0x5f;
  }
  *(undefined1 *)((long)__s + (long)(kvs_config.custom_cmp_param._4_4_ + -0x101)) = 0;
  for (idx = 0; idx < 300; idx = idx + 1) {
    *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105c03;
    sprintf((char *)&write_fail_cb,"%08d",(ulong)(uint)idx);
    *__s = (size_t)write_fail_cb;
    for (r = 0; r < 0x14; r = r + 1) {
      uVar5 = idx * 0x14 + r;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105c4c;
      sprintf((char *)&write_fail_cb,"%08d",(ulong)(uint)r);
      *(anomalous_callbacks **)
       ((long)&stack0xffffffffffff3f70 + (kvs_config.custom_cmp_param._4_4_ + -0x101) + lVar3) =
           write_fail_cb;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105c80;
      sprintf(bodybuf + 0xf8,"meta%d",(ulong)uVar5);
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105c98;
      sprintf(temp + 0xf8,"body%d",(ulong)uVar5);
      local_500 = alStack_c078 + (long)(int)uVar5 + -2;
      local_4f8 = __s;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105ccb;
      sVar9 = strlen((char *)__s);
      local_4f0 = sVar9 + 1;
      local_4e8 = bodybuf + 0xf8;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105cf0;
      sVar9 = strlen(bodybuf + 0xf8);
      local_4e0 = sVar9 + 1;
      local_4d8 = temp + 0xf8;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105d15;
      sVar9 = strlen(temp + 0xf8);
      *(size_t *)((long)asStackY_c0a0 + lVar3 + 8) = sVar9 + 1;
      *(undefined8 *)((long)asStackY_c0a0 + lVar3) = 0x105d50;
      fdb_doc_create(*(fdb_doc ***)((long)alStack_c078 + lVar3),
                     *(void **)((long)alStack_c078 + lVar3 + -8),*__s,
                     *(void **)((long)&stack0xffffffffffff3f70 + lVar3),
                     *(size_t *)((long)asStackY_c0a0 + lVar3 + 8),
                     *(void **)((long)asStackY_c0a0 + lVar3),
                     *(size_t *)((long)alStack_c078 + lVar3 + 0x18));
    }
  }
  for (idx = 0; idx < 6000; idx = idx + 1) {
    doc_00 = (fdb_doc *)alStack_c078[(long)idx + -2];
    *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105d9f;
    fdb_set((fdb_kvs_handle *)doc,doc_00);
  }
  *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105db8;
  fdb_commit((fdb_file_handle *)*__s,(&fStackY_c089)[lVar3]);
  idx = 0;
  do {
    if (5999 < idx) {
LAB_0010611e:
      if (!bVar4) {
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x10614b;
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0xa3);
        write_failure_test::__test_pass = 0;
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x10617f;
        __assert_fail("anomaly_hit",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0xa3,"void write_failure_test()");
      }
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x10618a;
      fdb_close((fdb_file_handle *)*__s);
      for (idx = 0; idx < 6000; idx = idx + 1) {
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x1061b3;
        fdb_doc_free(*(fdb_doc **)((long)&stack0xffffffffffff3f70 + lVar3));
      }
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x1061c3;
      fdb_shutdown();
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x1061c8;
      memleak_end();
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x1061e9;
      sprintf((char *)&write_fail_cb,"write failure test: %d failures out of %d writes",0,0);
      if (write_failure_test::__test_pass == 0) {
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x106232;
        fprintf(_stderr,"%s FAILED\n",&write_fail_cb);
      }
      else {
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x106211;
        fprintf(_stderr,"%s PASSED\n",&write_fail_cb);
      }
      return;
    }
    *(undefined8 *)((long)asStackY_c0a0 + lVar3 + 8) = 0;
    *(undefined8 *)((long)asStackY_c0a0 + lVar3) = 0x105e19;
    fdb_doc_create(*(fdb_doc ***)((long)alStack_c078 + lVar3),
                   *(void **)((long)alStack_c078 + lVar3 + -8),*__s,
                   *(void **)((long)&stack0xffffffffffff3f70 + lVar3),
                   *(size_t *)((long)asStackY_c0a0 + lVar3 + 8),
                   *(void **)((long)asStackY_c0a0 + lVar3),
                   *(size_t *)((long)alStack_c078 + lVar3 + 0x18));
    *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105e2d;
    fVar6 = fdb_get((fdb_kvs_handle *)doc,_anomaly_hit);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105e48;
      fdb_doc_free(*(fdb_doc **)((long)&stack0xffffffffffff3f70 + lVar3));
      bVar4 = true;
      goto LAB_0010611e;
    }
    pvVar1 = _anomaly_hit->key;
    pvVar2 = *(void **)(alStack_c078[(long)idx + -2] + 0x20);
    sVar9 = _anomaly_hit->keylen;
    *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105ee7;
    iVar7 = memcmp(pvVar1,pvVar2,sVar9);
    if (iVar7 != 0) {
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105f14;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x9e);
      write_failure_test::__test_pass = 0;
      pvVar1 = _anomaly_hit->key;
      pvVar2 = *(void **)(alStack_c078[(long)idx + -2] + 0x20);
      sVar9 = _anomaly_hit->keylen;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105f4b;
      iVar7 = memcmp(pvVar1,pvVar2,sVar9);
      if (iVar7 != 0) {
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105f7a;
        __assert_fail("!memcmp(rdoc->key, doc[i]->key, rdoc->keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x9e,"void write_failure_test()");
      }
    }
    pvVar1 = _anomaly_hit->meta;
    pvVar2 = *(void **)(alStack_c078[(long)idx + -2] + 0x38);
    sVar9 = _anomaly_hit->metalen;
    *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105faa;
    iVar7 = memcmp(pvVar1,pvVar2,sVar9);
    if (iVar7 != 0) {
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x105fd7;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x9f);
      write_failure_test::__test_pass = 0;
      pvVar1 = _anomaly_hit->meta;
      pvVar2 = *(void **)(alStack_c078[(long)idx + -2] + 0x38);
      sVar9 = _anomaly_hit->metalen;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x10600f;
      iVar7 = memcmp(pvVar1,pvVar2,sVar9);
      if (iVar7 != 0) {
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x10603e;
        __assert_fail("!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x9f,"void write_failure_test()");
      }
    }
    pvVar1 = _anomaly_hit->body;
    pvVar2 = *(void **)(alStack_c078[(long)idx + -2] + 0x40);
    sVar9 = _anomaly_hit->bodylen;
    *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x10606e;
    iVar7 = memcmp(pvVar1,pvVar2,sVar9);
    if (iVar7 != 0) {
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x10609b;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0xa0);
      write_failure_test::__test_pass = 0;
      pvVar1 = _anomaly_hit->body;
      pvVar2 = *(void **)(alStack_c078[(long)idx + -2] + 0x40);
      sVar9 = _anomaly_hit->bodylen;
      *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x1060d3;
      iVar7 = memcmp(pvVar1,pvVar2,sVar9);
      if (iVar7 != 0) {
        *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x106102;
        __assert_fail("!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0xa0,"void write_failure_test()");
      }
    }
    *(undefined8 *)((long)&stack0xffffffffffff3f70 + lVar3) = 0x106110;
    fdb_doc_free(*(fdb_doc **)((long)&stack0xffffffffffff3f70 + lVar3));
    idx = idx + 1;
  } while( true );
}

Assistant:

void write_failure_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, idx, r;
    int n=300, m=20; // n: # prefixes, m: # postfixes
    int keylen_limit;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n*m);
    fdb_doc *rdoc;
    fdb_status status;
    int anomaly_hit = 0;

    char *keybuf;
    char metabuf[256], bodybuf[256], temp[256];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *write_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));
    // Modify the pwrite callback to redirect to test-specific function
    write_fail_cb->pwrite_cb = &pwrite_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(write_fail_cb, &fail_ctx);

    // The number indicates the count after which all writes begin to fail
    // This number is unique to this test suite and can cause a segmentation
    // fault if the underlying fixed issue resurfaces
    fail_ctx.start_failing_after = 10112;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    keylen_limit = fconfig.blocksize - 256;
    keybuf = alca(char, keylen_limit);

    // open db
    fdb_open(&dbfile, "anomaly_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // key structure:
    // <------------ <keylen_limit> bytes ------------->
    // <-- 8 bytes -->             <-- 8 bytes  -->< 1 >
    // [prefix number]____ ... ____[postfix number][ \0]
    // e.g.)
    // 00000001____ ... ____00000013[\0]

    // create docs
    for (i=0;i<keylen_limit-1;++i){
        keybuf[i] = '_';
    }
    keybuf[keylen_limit-1] = 0;

    for (i=0;i<n;++i){
        // set prefix
        sprintf(temp, "%08d", i);
        memcpy(keybuf, temp, 8);
        for (j=0;j<m;++j){
            idx = i*m + j;
            // set postfix
            sprintf(temp, "%08d", j);
            memcpy(keybuf + (keylen_limit-1) - 8, temp, 8);
            sprintf(metabuf, "meta%d", idx);
            sprintf(bodybuf, "body%d", idx);
            fdb_doc_create(&doc[idx], (void*)keybuf, strlen(keybuf)+1,
                                    (void*)metabuf, strlen(metabuf)+1,
                                    (void*)bodybuf, strlen(bodybuf)+1);
        }
    }

    // insert docs
    for (i=0;i<n*m;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // retrieval check
    for (i=0;i<n*m;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (status != FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            anomaly_hit = 1;
            break;
        }
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
    }
    TEST_CHK(anomaly_hit);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n*m;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(temp, "write failure test: %d failures out of %d writes",
            fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(temp);
}